

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O3

void __thiscall psy::C::SemanticModelTester::case0091(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppDVar2;
  Symbol *pSVar3;
  DeclarationCategory DVar4;
  SymbolKind SVar5;
  TypeKind TVar6;
  BasicTypeKind BVar7;
  int iVar8;
  undefined4 extraout_var;
  Lexeme *pLVar9;
  Type *pTVar10;
  undefined4 extraout_var_00;
  FunctionDeclarationSymbol *this_01;
  undefined4 extraout_var_02;
  undefined8 uVar11;
  ostream *poVar12;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_> syms
  ;
  string local_70;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
  local_50;
  SemanticModel *local_30;
  VariableAndOrFunctionDeclarationSyntax *local_28;
  ObjectDeclarationSymbol *this_00;
  undefined4 extraout_var_01;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"int x , y ( int z ) ;","");
  pppDVar2 = &local_50.
              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.
  super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pppDVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd0,(string *)this,&local_70);
  if (local_50.
      super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)pppDVar2) {
    operator_delete(local_50.
                    super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  SemanticModel::variablesAndOrFunctionsFor(&local_50,local_30,local_28);
  if ((long)local_50.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0xe9);
    std::endl<char,std::char_traits<char>>(poVar12);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pSVar3 = &(*local_50.
              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_Symbol;
  if (pSVar3 == (Symbol *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
    poVar12 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    iVar8 = 0xec;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
LAB_003da8da:
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar8);
    std::endl<char,std::char_traits<char>>(poVar12);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
  if (DVar4 != Object) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
    poVar12 = C::operator<<((ostream *)&std::cout,DVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Object",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    iVar8 = 0xed;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    goto LAB_003da8da;
  }
  SVar5 = Symbol::kind(pSVar3);
  if (SVar5 != VariableDeclaration) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    SVar5 = Symbol::kind(pSVar3);
    poVar12 = C::operator<<((ostream *)&std::cout,SVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"VariableDeclaration",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    iVar8 = 0xee;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    goto LAB_003da8da;
  }
  iVar8 = (*pSVar3->_vptr_Symbol[0xd])(pSVar3);
  this_00 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar8);
  pLVar9 = &ObjectDeclarationSymbol::name(this_00)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
  iVar8 = std::__cxx11::string::compare((char *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (iVar8 == 0) {
    pTVar10 = ObjectDeclarationSymbol::type(this_00);
    TVar6 = Type::kind(pTVar10);
    if (TVar6 == Basic) {
      pTVar10 = ObjectDeclarationSymbol::type(this_00);
      iVar8 = (*pTVar10->_vptr_Type[5])(pTVar10);
      BVar7 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar8));
      if (BVar7 == Int_S) {
        pSVar3 = &local_50.
                  super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->super_Symbol;
        if (pSVar3 == (Symbol *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
          poVar12 = (ostream *)&std::cout;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                     ,99);
          iVar8 = 0xf5;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
LAB_003dae93:
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar8);
          std::endl<char,std::char_traits<char>>(poVar12);
          uVar11 = __cxa_allocate_exception(1);
          __cxa_throw(uVar11,&TestFailed::typeinfo,0);
        }
        DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
        if (DVar4 != Function) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tActual  : ",0xc);
          DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
          poVar12 = C::operator<<((ostream *)&std::cout,DVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Function",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                     ,99);
          iVar8 = 0xf6;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
          goto LAB_003dae93;
        }
        SVar5 = Symbol::kind(pSVar3);
        if (SVar5 != FunctionDeclaration) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tActual  : ",0xc);
          SVar5 = Symbol::kind(pSVar3);
          poVar12 = C::operator<<((ostream *)&std::cout,SVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"FunctionDeclaration",0x13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                     ,99);
          iVar8 = 0xf7;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
          goto LAB_003dae93;
        }
        iVar8 = (*pSVar3->_vptr_Symbol[9])(pSVar3);
        this_01 = (FunctionDeclarationSymbol *)CONCAT44(extraout_var_01,iVar8);
        if (this_01 == (FunctionDeclarationSymbol *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
          poVar12 = (ostream *)&std::cout;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                     ,99);
          iVar8 = 0xf9;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        }
        else {
          pLVar9 = &FunctionDeclarationSymbol::name(this_01)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
          iVar8 = std::__cxx11::string::compare((char *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (iVar8 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tActual  : ",0xc);
            pLVar9 = &FunctionDeclarationSymbol::name(this_01)->super_Lexeme;
            Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_70._M_dataplus._M_p,
                                 local_70._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"y",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                       ,99);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0xfa);
            std::endl<char,std::char_traits<char>>(poVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            goto LAB_003db13e;
          }
          pTVar10 = FunctionDeclarationSymbol::type(this_01);
          TVar6 = Type::kind(pTVar10);
          if (TVar6 == Function) {
            if (local_50.
                super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_50.
                              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_50.
                                    super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_50.
                                    super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            return;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tActual  : ",0xc);
          pTVar10 = FunctionDeclarationSymbol::type(this_01);
          TVar6 = Type::kind(pTVar10);
          poVar12 = ::operator<<((ostream *)&std::cout,TVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Function",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                     ,99);
          iVar8 = 0xfb;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
        }
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar8);
        std::endl<char,std::char_traits<char>>(poVar12);
LAB_003db13e:
        uVar11 = __cxa_allocate_exception(1);
        __cxa_throw(uVar11,&TestFailed::typeinfo,0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pTVar10 = ObjectDeclarationSymbol::type(this_00);
      iVar8 = (*pTVar10->_vptr_Type[5])(pTVar10);
      BVar7 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar8));
      poVar12 = C::operator<<((ostream *)&std::cout,BVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"signed int",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      iVar8 = 0xf2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pTVar10 = ObjectDeclarationSymbol::type(this_00);
      TVar6 = Type::kind(pTVar10);
      poVar12 = ::operator<<((ostream *)&std::cout,TVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Basic",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      iVar8 = 0xf1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    }
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar8);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    pLVar9 = &ObjectDeclarationSymbol::name(this_00)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"x",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0xf0);
    std::endl<char,std::char_traits<char>>(poVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  uVar11 = __cxa_allocate_exception(1);
  __cxa_throw(uVar11,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0091()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("int x , y ( int z ) ;");

    auto syms = semaModel->variablesAndOrFunctionsFor(varAndOrFunDeclNode);
    PSY_EXPECT_EQ_INT(syms.size(), 2);

    const DeclarationSymbol* declSym0 = syms[0];
    PSY_EXPECT_TRUE(declSym0);
    PSY_EXPECT_EQ_ENU(declSym0->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym0->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym0 = declSym0->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym0->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(varDeclSym0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(varDeclSym0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    const DeclarationSymbol* declSym1 = syms[1];
    PSY_EXPECT_TRUE(declSym1);
    PSY_EXPECT_EQ_ENU(declSym1->category(), DeclarationCategory::Function, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym1->kind(), SymbolKind::FunctionDeclaration, SymbolKind);
    const FunctionDeclarationSymbol* funcDeclSym1 = declSym1->asFunctionDeclaration();
    PSY_EXPECT_TRUE(funcDeclSym1);
    PSY_EXPECT_EQ_STR(funcDeclSym1->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(funcDeclSym1->type()->kind(), TypeKind::Function, TypeKind);
}